

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

int setup_compound_params_from_comp_idx
              (AV1_COMP *cpi,MACROBLOCK *x,buf_2d (*yv12_mb) [3],PREDICTION_MODE *this_mode,
              MV_REFERENCE_FRAME *ref_frame,MV_REFERENCE_FRAME *ref_frame2,int_mv (*frame_mv) [8],
              int *use_ref_frame_mask,int comp_index,_Bool comp_use_zero_zeromv_only,
              MV_REFERENCE_FRAME *last_comp_ref_frame,BLOCK_SIZE bsize)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  byte *in_RCX;
  long lVar4;
  long in_RSI;
  long in_RDI;
  MACROBLOCK *in_R8;
  char *in_R9;
  int ref_mv_idx;
  int *unaff_retaddr;
  int skip_alt;
  int skip_gf;
  MV_REFERENCE_FRAME *rf;
  int in_stack_00000018;
  undefined3 in_stack_0000001c;
  COMP_REF_MODE *pCVar5;
  undefined7 in_stack_ffffffffffffffc0;
  int local_4;
  
  bVar3 = (byte)ref_frame2 & 1;
  lVar4 = (long)in_stack_00000018;
  pCVar5 = comp_ref_mode_set + lVar4;
  bVar1 = false;
  bVar2 = false;
  *in_RCX = comp_ref_mode_set[in_stack_00000018].pred_mode;
  *(MV_REFERENCE_FRAME *)&in_R8->plane[0].src_diff = pCVar5->ref_frame[0];
  *in_R9 = comp_ref_mode_set[lVar4].ref_frame[1];
  if ((*(uint *)(in_RSI + 0x25640) < 0x32) && (6 < (byte)this_mode)) {
    if ((*(char *)(in_RSI + 0x25622) == '\x01') || (*(char *)(in_RSI + 0x25623) == '\x01')) {
      bVar1 = true;
    }
    if ((*(char *)(in_RSI + 0x25624) == '\x01') || (*(char *)(in_RSI + 0x25625) == '\x01')) {
      bVar2 = true;
    }
  }
  if ((((ulong)ref_frame2 & 1) == 0) || (*in_RCX == 0x17)) {
    if ((*in_R9 == '\x04') &&
       (((*(int *)(in_RDI + 0x60cbc) == 0 || (bVar1)) || ((*(uint *)(in_RDI + 0x608b8) & 8) == 0))))
    {
      local_4 = 0;
    }
    else if ((*in_R9 == '\x02') &&
            ((*(int *)(in_RDI + 0x60cc0) == 0 || ((*(uint *)(in_RDI + 0x608b8) & 2) == 0)))) {
      local_4 = 0;
    }
    else if ((*in_R9 == '\a') &&
            (((*(int *)(in_RDI + 0x60cc4) == 0 || (bVar2)) ||
             ((*(uint *)(in_RDI + 0x608b8) & 0x40) == 0)))) {
      local_4 = 0;
    }
    else {
      if (*ref_frame != comp_ref_mode_set[lVar4].ref_frame[1]) {
        setup_compound_prediction
                  ((AV1_COMMON *)ref_frame,(MACROBLOCK *)ref_frame2,
                   (buf_2d (*) [3])CONCAT44(_in_stack_0000001c,in_stack_00000018),(int *)rf,
                   _skip_alt,unaff_retaddr);
        *ref_frame = pCVar5->ref_frame[1];
      }
      set_compound_mode(in_R8,(MV_REFERENCE_FRAME)((ulong)in_R9 >> 0x38),
                        (MV_REFERENCE_FRAME)((ulong)in_R9 >> 0x30),(int)in_R9,
                        (int_mv (*) [8])CONCAT17(bVar3,in_stack_ffffffffffffffc0),
                        (PREDICTION_MODE)((ulong)pCVar5 >> 0x38));
      if (((*in_RCX == 0x17) ||
          (*(int *)(_skip_alt + (long)*(char *)&in_R8->plane[0].src_diff * 4 + (ulong)*in_RCX * 0x20
                   ) != 0)) || (*(int *)(_skip_alt + (long)*in_R9 * 4 + (ulong)*in_RCX * 0x20) != 0)
         ) {
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int setup_compound_params_from_comp_idx(
    const AV1_COMP *cpi, MACROBLOCK *x, struct buf_2d yv12_mb[8][MAX_MB_PLANE],
    PREDICTION_MODE *this_mode, MV_REFERENCE_FRAME *ref_frame,
    MV_REFERENCE_FRAME *ref_frame2, int_mv frame_mv[MB_MODE_COUNT][REF_FRAMES],
    const int *use_ref_frame_mask, int comp_index,
    bool comp_use_zero_zeromv_only, MV_REFERENCE_FRAME *last_comp_ref_frame,
    BLOCK_SIZE bsize) {
  const MV_REFERENCE_FRAME *rf = comp_ref_mode_set[comp_index].ref_frame;
  int skip_gf = 0;
  int skip_alt = 0;
  *this_mode = comp_ref_mode_set[comp_index].pred_mode;
  *ref_frame = rf[0];
  *ref_frame2 = rf[1];
  assert(*ref_frame == LAST_FRAME);
  assert(*this_mode == GLOBAL_GLOBALMV || *this_mode == NEAREST_NEARESTMV);
  if (x->source_variance < 50 && bsize > BLOCK_16X16) {
    if (x->color_sensitivity_sb_g[COLOR_SENS_IDX(AOM_PLANE_U)] == 1 ||
        x->color_sensitivity_sb_g[COLOR_SENS_IDX(AOM_PLANE_V)] == 1)
      skip_gf = 1;
    if (x->color_sensitivity_sb_alt[COLOR_SENS_IDX(AOM_PLANE_U)] == 1 ||
        x->color_sensitivity_sb_alt[COLOR_SENS_IDX(AOM_PLANE_V)] == 1)
      skip_alt = 1;
  }
  if (comp_use_zero_zeromv_only && *this_mode != GLOBAL_GLOBALMV) {
    return 0;
  }
  if (*ref_frame2 == GOLDEN_FRAME &&
      (cpi->sf.rt_sf.ref_frame_comp_nonrd[0] == 0 || skip_gf ||
       !(cpi->ref_frame_flags & AOM_GOLD_FLAG))) {
    return 0;
  } else if (*ref_frame2 == LAST2_FRAME &&
             (cpi->sf.rt_sf.ref_frame_comp_nonrd[1] == 0 ||
              !(cpi->ref_frame_flags & AOM_LAST2_FLAG))) {
    return 0;
  } else if (*ref_frame2 == ALTREF_FRAME &&
             (cpi->sf.rt_sf.ref_frame_comp_nonrd[2] == 0 || skip_alt ||
              !(cpi->ref_frame_flags & AOM_ALT_FLAG))) {
    return 0;
  }
  int ref_mv_idx = 0;
  if (*last_comp_ref_frame != rf[1]) {
    // Only needs to be done once per reference pair.
    setup_compound_prediction(&cpi->common, x, yv12_mb, use_ref_frame_mask, rf,
                              &ref_mv_idx);
    *last_comp_ref_frame = rf[1];
  }
  set_compound_mode(x, *ref_frame, *ref_frame2, ref_mv_idx, frame_mv,
                    *this_mode);
  if (*this_mode != GLOBAL_GLOBALMV &&
      frame_mv[*this_mode][*ref_frame].as_int == 0 &&
      frame_mv[*this_mode][*ref_frame2].as_int == 0) {
    return 0;
  }

  return 1;
}